

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

tuple<mjs::value,_mjs::value> * __thiscall
mjs::interpreter::impl::eval_call_member
          (tuple<mjs::value,_mjs::value> *__return_storage_ptr__,impl *this,expression *member)

{
  int iVar1;
  value l;
  value r;
  value vStack_98;
  value local_70;
  value local_48;
  
  iVar1 = (*(member->super_syntax_node)._vptr_syntax_node[3])(member);
  if ((iVar1 == 9) &&
     ((iVar1 = *(int *)&member[1].super_syntax_node._vptr_syntax_node, iVar1 == 0x32 ||
      (iVar1 == 0x25)))) {
    eval(&local_70,this,
         (expression *)
         member[1].super_syntax_node.extend_.file.
         super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    get_value(&vStack_98,this,&local_70);
    value::destroy(&local_70);
    eval(&local_70,this,
         (expression *)
         member[1].super_syntax_node.extend_.file.
         super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    make_reference(&local_48,this,&vStack_98,&local_70);
    std::_Tuple_impl<0ul,mjs::value,mjs::value>::_Tuple_impl<mjs::value,mjs::value&,void>
              ((_Tuple_impl<0ul,mjs::value,mjs::value> *)__return_storage_ptr__,&local_48,&vStack_98
              );
    value::destroy(&local_48);
    value::destroy(&local_70);
    value::destroy(&vStack_98);
  }
  else {
    eval(&vStack_98,this,member);
    std::_Tuple_impl<0ul,mjs::value,mjs::value>::_Tuple_impl<mjs::value,mjs::value_const&,void>
              ((_Tuple_impl<0ul,mjs::value,mjs::value> *)__return_storage_ptr__,&vStack_98,
               (value *)&value::undefined);
    value::destroy(&vStack_98);
  }
  return __return_storage_ptr__;
}

Assistant:

auto eval_call_member(const expression& member) {
        // For strict mode we need to check if the MemberExpresson results in a primtive type
        // to be able to pass it on to the called function (even if the expression occurs in
        // a non-strict context)
        if (member.type() == expression_type::binary) {
            const auto& be = static_cast<const binary_expression&>(member);
            if (is_reference_op(be.op())) {
                // Commit to handling the evaluation
                auto l = get_value(eval(be.lhs()));
                auto r = eval(be.rhs());
                return std::tuple(make_reference(l, r), l);
            }
        }
        return std::tuple(eval(member), value::undefined);
    }